

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcList_item *pSrc,Bitmask notReady,
               WhereLevel *pLevel)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  u8 uVar4;
  short sVar5;
  Vdbe *p;
  Table *pTVar6;
  WhereLoop *p_00;
  sqlite3 *db;
  SrcList *pSVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Expr *pEVar15;
  Index *pIdx;
  CollSeq *pCVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  WhereTerm *pWVar20;
  Op *pOVar21;
  WhereTerm *pWVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  Expr *local_c0;
  char *zNotUsed;
  code *local_58;
  code *local_50;
  u8 local_3c;
  anon_union_8_14_c5524298_for_u local_38;
  
  p = pParse->pVdbe;
  iVar23 = 0;
  iVar11 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  pTVar6 = pSrc->pTab;
  pWVar22 = pWC->a;
  pWVar20 = pWVar22 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar26 = 0xffffffffffffffff;
    local_c0 = (Expr *)0x0;
  }
  else {
    iVar23 = 0;
    uVar26 = 0;
    bVar8 = false;
    local_c0 = (Expr *)0x0;
    do {
      if (((p_00->prereq == 0) && ((pWVar22->wtFlags & 2) == 0)) &&
         (pEVar15 = pWVar22->pExpr, (pEVar15->flags & 1) == 0)) {
        local_38.n = pSrc->iCursor;
        local_3c = '\x03';
        local_58 = exprNodeIsConstant;
        local_50 = sqlite3SelectWalkFail;
        if (pEVar15 != (Expr *)0x0) {
          walkExpr((Walker *)&zNotUsed,pEVar15);
        }
        if (local_3c != '\0') {
          db = pParse->db;
          if (pEVar15 == (Expr *)0x0) {
            pEVar15 = (Expr *)0x0;
          }
          else {
            pEVar15 = exprDup(db,pEVar15,0,(u8 **)0x0);
          }
          local_c0 = sqlite3ExprAnd(db,local_c0,pEVar15);
        }
      }
      iVar12 = termCanDriveIndex(pWVar22,pSrc,notReady);
      if (iVar12 == 0) {
LAB_0017f53a:
        bVar9 = true;
      }
      else {
        iVar12 = (pWVar22->u).leftColumn;
        uVar28 = 1L << ((byte)iVar12 & 0x3f);
        if (0x3f < (long)iVar12) {
          uVar28 = 0x8000000000000000;
        }
        if (!bVar8) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar6->zName,pTVar6->aCol[iVar12].zName);
        }
        bVar8 = true;
        if ((uVar28 & uVar26) != 0) goto LAB_0017f53a;
        iVar12 = whereLoopResize(pParse->db,p_00,iVar23 + 1);
        if (iVar12 == 0) {
          p_00->aLTerm[iVar23] = pWVar22;
          uVar26 = uVar26 | uVar28;
          bVar8 = true;
          bVar9 = true;
          iVar23 = iVar23 + 1;
        }
        else {
          bVar8 = true;
          bVar9 = false;
        }
      }
      if (!bVar9) goto LAB_0017fac1;
      pWVar22 = pWVar22 + 1;
    } while (pWVar22 < pWVar20);
    uVar26 = ~uVar26 | 0x8000000000000000;
  }
  p_00->nLTerm = (u16)iVar23;
  (p_00->u).btree.nEq = (u16)iVar23;
  p_00->wsFlags = 0x4241;
  uVar26 = uVar26 & pSrc->colUsed;
  sVar5 = pTVar6->nCol;
  uVar25 = (uint)sVar5;
  uVar17 = 0x3f;
  if (sVar5 < 0x3f) {
    uVar17 = uVar25;
  }
  if (0 < (int)uVar25) {
    uVar28 = 0;
    do {
      iVar23 = iVar23 + (uint)((uVar26 >> (uVar28 & 0x3f) & 1) != 0);
      uVar28 = uVar28 + 1;
    } while (uVar17 != uVar28);
  }
  iVar12 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar12 = uVar25 - 0x3e;
  }
  uVar28 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar12 + iVar23),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar6;
    pWVar22 = pWC->a;
    if (pWVar22 < pWVar20) {
      uVar28 = 0;
      uVar29 = 0;
      do {
        iVar13 = termCanDriveIndex(pWVar22,pSrc,notReady);
        if (iVar13 != 0) {
          iVar13 = (pWVar22->u).leftColumn;
          uVar24 = 1L << ((byte)iVar13 & 0x3f);
          if (0x3f < iVar13) {
            uVar24 = 0x8000000000000000;
          }
          if ((uVar24 & uVar29) == 0) {
            pEVar15 = pWVar22->pExpr;
            iVar18 = (int)uVar28;
            pIdx->aiColumn[iVar18] = (i16)iVar13;
            pCVar16 = sqlite3BinaryCompareCollSeq(pParse,pEVar15->pLeft,pEVar15->pRight);
            pcVar19 = "BINARY";
            if (pCVar16 != (CollSeq *)0x0) {
              pcVar19 = pCVar16->zName;
            }
            uVar29 = uVar29 | uVar24;
            pIdx->azColl[iVar18] = pcVar19;
            uVar28 = (ulong)(iVar18 + 1);
          }
        }
        pWVar22 = pWVar22 + 1;
      } while (pWVar22 < pWVar20);
    }
    if (0 < sVar5) {
      uVar29 = 0;
      do {
        if ((uVar26 >> (uVar29 & 0x3f) & 1) != 0) {
          iVar13 = (int)uVar28;
          pIdx->aiColumn[iVar13] = (i16)uVar29;
          pIdx->azColl[iVar13] = "BINARY";
          uVar28 = (ulong)(iVar13 + 1);
        }
        uVar29 = uVar29 + 1;
      } while (uVar17 != uVar29);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar6->nCol)) {
      uVar28 = (ulong)(int)uVar28;
      iVar13 = 0x3f;
      do {
        pIdx->aiColumn[uVar28] = (i16)iVar13;
        pIdx->azColl[uVar28] = "BINARY";
        uVar28 = uVar28 + 1;
        iVar13 = iVar13 + 1;
      } while (iVar13 < pTVar6->nCol);
    }
    iVar27 = (int)uVar28;
    pIdx->aiColumn[iVar27] = -1;
    pIdx->azColl[iVar27] = "BINARY";
    iVar13 = pParse->nTab;
    pParse->nTab = iVar13 + 1;
    pLevel->iIdxCur = iVar13;
    iVar18 = 0;
    sqlite3VdbeAddOp3(p,0x70,iVar13,iVar12 + iVar23,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    pSVar7 = pWC->pWInfo->pTabList;
    bVar3 = pLevel->iFrom;
    if ((pSVar7->a[bVar3].fg.field_0x1 & 0x10) == 0) {
      iVar23 = pLevel->iTabCur;
      iVar12 = 0x24;
    }
    else {
      iVar23 = pSVar7->a[bVar3].regReturn;
      iVar18 = sqlite3VdbeAddOp3(p,0x46,0,0,0);
      sqlite3VdbeAddOp3(p,0xd,iVar23,0,pSVar7->a[bVar3].addrFillSub);
      iVar12 = 0xe;
    }
    iVar23 = sqlite3VdbeAddOp3(p,iVar12,iVar23,0,0);
    if (local_c0 == (Expr *)0x0) {
      iVar12 = 0;
    }
    else {
      iVar12 = pParse->nLabel + -1;
      pParse->nLabel = iVar12;
      sqlite3ExprIfFalse(pParse,local_c0,iVar12,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
    }
    if (pParse->nTempReg == '\0') {
      iVar13 = pParse->nMem + 1;
      pParse->nMem = iVar13;
    }
    else {
      bVar10 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar10;
      iVar13 = pParse->aTempReg[bVar10];
    }
    iVar14 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,iVar13,0,(int *)0x0,(Index *)0x0,0)
    ;
    sqlite3VdbeAddOp3(p,0x84,pLevel->iIdxCur,iVar13,0);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x10;
    }
    if (local_c0 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(p,iVar12);
    }
    if ((pSVar7->a[bVar3].fg.field_0x1 & 0x10) == 0) {
      sqlite3VdbeAddOp3(p,5,pLevel->iTabCur,iVar23 + 1,0);
    }
    else {
      if (iVar18 < 0) {
        iVar18 = p->nOp + -1;
      }
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + iVar18;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = iVar14 + iVar27;
      translateColumnToCopy(pParse,iVar23,pLevel->iTabCur,pSVar7->a[bVar3].regResult,1);
      sqlite3VdbeAddOp3(p,0xb,0,iVar23,0);
      puVar2 = &pSVar7->a[bVar3].fg.field_0x1;
      *puVar2 = *puVar2 & 0xef;
    }
    iVar12 = p->nOp;
    if (0 < (long)iVar12) {
      p->aOp[(long)iVar12 + -1].p5 = 3;
    }
    uVar4 = p->db->mallocFailed;
    if (uVar4 == '\0') {
      iVar18 = iVar12 + -1;
      if (-1 < iVar23) {
        iVar18 = iVar23;
      }
      pOVar21 = p->aOp + iVar18;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = iVar12;
    if (iVar13 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar13;
      }
    }
    if (uVar4 == '\0') {
      iVar23 = p->nOp + -1;
      if (-1 < iVar11) {
        iVar23 = iVar11;
      }
      pOVar21 = p->aOp + iVar23;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = p->nOp;
  }
LAB_0017fac1:
  if (local_c0 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,local_c0);
  }
  return;
}

Assistant:

static void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  struct SrcList_item *pSrc,  /* The FROM clause term to get the next index */
  Bitmask notReady,           /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  struct SrcList_item *pTabItem;  /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    assert( !ExprHasProperty(pExpr, EP_FromJoin)    /* prereq always non-zero */
         || pExpr->iRightJoinTable!=pSrc->iCursor   /*   for the right-hand   */
         || pLoop->prereq!=0 );                     /*   table of a LEFT JOIN */
    if( pLoop->prereq==0
     && (pTerm->wtFlags & TERM_VIRTUAL)==0
     && !ExprHasProperty(pExpr, EP_FromJoin)
     && sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor) ){
      pPartial = sqlite3ExprAnd(pParse->db, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.leftColumn;
        pColl = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pX->pRight);
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, 1);
    sqlite3VdbeGoto(v, addrTop);
    pTabItem->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
  }
  sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);
  
  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}